

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void __thiscall Client::HandleTimeout(Client *this,void *param_1)

{
  bool bVar1;
  ostream *this_00;
  reference this_01;
  element_type *peVar2;
  pair<const_std::shared_ptr<cppnet::CNSocket>,_Session_*> *session;
  iterator __end1;
  iterator __begin1;
  unordered_map<std::shared_ptr<cppnet::CNSocket>,_Session_*,_std::hash<std::shared_ptr<cppnet::CNSocket>_>,_std::equal_to<std::shared_ptr<cppnet::CNSocket>_>,_std::allocator<std::pair<const_std::shared_ptr<cppnet::CNSocket>,_Session_*>_>_>
  *__range1;
  lock_guard<std::mutex> lock;
  void *param_1_local;
  Client *this_local;
  
  lock._M_device = (mutex_type *)param_1;
  this_00 = std::operator<<((ostream *)&std::cout,"timeout, to stop connections");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&__range1,&this->_mutex);
  __end1 = std::
           unordered_map<std::shared_ptr<cppnet::CNSocket>,_Session_*,_std::hash<std::shared_ptr<cppnet::CNSocket>_>,_std::equal_to<std::shared_ptr<cppnet::CNSocket>_>,_std::allocator<std::pair<const_std::shared_ptr<cppnet::CNSocket>,_Session_*>_>_>
           ::begin(&this->_sessions);
  session = (pair<const_std::shared_ptr<cppnet::CNSocket>,_Session_*> *)
            std::
            unordered_map<std::shared_ptr<cppnet::CNSocket>,_Session_*,_std::hash<std::shared_ptr<cppnet::CNSocket>_>,_std::equal_to<std::shared_ptr<cppnet::CNSocket>_>,_std::allocator<std::pair<const_std::shared_ptr<cppnet::CNSocket>,_Session_*>_>_>
            ::end(&this->_sessions);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_std::shared_ptr<cppnet::CNSocket>,_Session_*>,_false>
                       ,(_Node_iterator_base<std::pair<const_std::shared_ptr<cppnet::CNSocket>,_Session_*>,_false>
                         *)&session);
    if (!bVar1) break;
    this_01 = std::__detail::
              _Node_iterator<std::pair<const_std::shared_ptr<cppnet::CNSocket>,_Session_*>,_false,_false>
              ::operator*(&__end1);
    peVar2 = std::__shared_ptr_access<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this_01);
    (*peVar2->_vptr_CNSocket[6])();
    std::__detail::
    _Node_iterator<std::pair<const_std::shared_ptr<cppnet::CNSocket>,_Session_*>,_false,_false>::
    operator++(&__end1);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&__range1);
  return;
}

Assistant:

void HandleTimeout(void*) {
        std::cout << "timeout, to stop connections" << std::endl;
        std::lock_guard<std::mutex> lock(_mutex);
        for (auto& session : _sessions) {
            session.first->Close();
        }
    }